

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O2

int doinvbill(int mode)

{
  nh_menuitem *pnVar1;
  int iVar2;
  monst *mtmp;
  bill_x *pbVar3;
  obj *poVar4;
  char *pcVar5;
  long lVar6;
  uint uVar7;
  long cost;
  long cost_00;
  bill_x *pbVar8;
  menulist menu;
  
  mtmp = shop_keeper(level,u.ushops[0]);
  if ((mtmp == (monst *)0x0) || (iVar2 = inhishop(mtmp), iVar2 == 0)) {
    if (mode != 0) {
      warning("doinvbill: no shopkeeper?");
      return 0;
    }
  }
  else {
    if (mode == 0) {
      uVar7 = (uint)(*(int *)&mtmp[0x1b].field_0x60 != 0);
      pbVar8 = *(bill_x **)&mtmp[0x1b].mnum;
      pbVar3 = pbVar8 + *(short *)((long)&mtmp[0x1b].misc_worn_check + 2);
      for (; pbVar8 < pbVar3; pbVar8 = pbVar8 + 1) {
        if ((pbVar8->useup != '\0') ||
           ((poVar4 = bp_to_obj(pbVar8), poVar4 != (obj *)0x0 && (poVar4->quan < pbVar8->bquan)))) {
          uVar7 = uVar7 + 1;
        }
      }
      return uVar7;
    }
    init_menulist(&menu);
    if (menu.size <= menu.icount) {
      lVar6 = (long)menu.size;
      menu.size = menu.size * 2;
      menu.items = (nh_menuitem *)realloc(menu.items,lVar6 * 0x218);
    }
    menu.items[menu.icount].id = 0;
    menu.items[menu.icount].role = MI_TEXT;
    menu.items[menu.icount].accel = '\0';
    menu.items[menu.icount].group_accel = '\0';
    menu.items[menu.icount].selected = '\0';
    builtin_strncpy(menu.items[menu.icount].caption,"Unpaid articles ",0x10);
    builtin_strncpy(menu.items[menu.icount].caption + 0x10,"already used up:",0x10);
    menu.items[menu.icount].caption[0x20] = '\0';
    menu.icount = menu.icount + 1;
    if (menu.size <= menu.icount) {
      menu.size = menu.size * 2;
      menu.items = (nh_menuitem *)realloc(menu.items,(long)menu.size * 0x10c);
    }
    lVar6 = (long)menu.icount;
    menu.items[lVar6].accel = '\0';
    menu.items[lVar6].group_accel = '\0';
    cost_00 = 0;
    menu.items[lVar6].selected = '\0';
    menu.items[lVar6].caption[0] = '\0';
    menu.items[lVar6].id = 0;
    menu.items[lVar6].role = MI_TEXT;
    menu.icount = menu.icount + 1;
    pbVar8 = *(bill_x **)&mtmp[0x1b].mnum;
    pbVar3 = pbVar8 + *(short *)((long)&mtmp[0x1b].misc_worn_check + 2);
    for (; pbVar8 < pbVar3; pbVar8 = pbVar8 + 1) {
      poVar4 = bp_to_obj(pbVar8);
      if (poVar4 == (obj *)0x0) {
        warning("Bad shopkeeper administration.");
        goto LAB_0022fc70;
      }
      lVar6 = (long)pbVar8->bquan;
      if (pbVar8->useup == '\0') {
        if (poVar4->quan < pbVar8->bquan) {
          lVar6 = lVar6 - poVar4->quan;
          goto LAB_0022f952;
        }
      }
      else {
LAB_0022f952:
        uVar7 = *(uint *)&poVar4->field_0x4a;
        cost = pbVar8->price * lVar6;
        *(uint *)&poVar4->field_0x4a = uVar7 & 0xfffffffb;
        pcVar5 = xprname(poVar4,(char *)0x0,'x','\0',cost,lVar6);
        *(uint *)&poVar4->field_0x4a = *(uint *)&poVar4->field_0x4a & 0xfffffffb | uVar7 & 4;
        lVar6 = (long)menu.size;
        if (menu.size <= menu.icount) {
          menu.size = menu.size * 2;
          menu.items = (nh_menuitem *)realloc(menu.items,lVar6 * 0x218);
        }
        cost_00 = cost_00 + cost;
        pnVar1 = menu.items + menu.icount;
        pnVar1->id = 0;
        pnVar1->role = MI_TEXT;
        pnVar1->accel = '\0';
        pnVar1->group_accel = '\0';
        pnVar1->selected = '\0';
        strcpy(pnVar1->caption,pcVar5);
        menu.icount = menu.icount + 1;
      }
    }
    iVar2 = *(int *)&mtmp[0x1b].field_0x60;
    if (iVar2 != 0) {
      if (cost_00 != 0) {
        lVar6 = (long)menu.size;
        if (menu.size <= menu.icount) {
          menu.size = menu.size * 2;
          menu.items = (nh_menuitem *)realloc(menu.items,lVar6 * 0x218);
        }
        lVar6 = (long)menu.icount;
        menu.items[lVar6].accel = '\0';
        menu.items[lVar6].group_accel = '\0';
        menu.items[lVar6].selected = '\0';
        menu.items[lVar6].caption[0] = '\0';
        menu.items[lVar6].id = 0;
        menu.items[lVar6].role = MI_TEXT;
        menu.icount = menu.icount + 1;
        iVar2 = *(int *)&mtmp[0x1b].field_0x60;
      }
      pcVar5 = xprname((obj *)0x0,"usage charges and/or other fees",'$','\0',(long)iVar2,0);
      lVar6 = (long)menu.size;
      if (menu.size <= menu.icount) {
        menu.size = menu.size * 2;
        menu.items = (nh_menuitem *)realloc(menu.items,lVar6 * 0x218);
      }
      cost_00 = cost_00 + iVar2;
      pnVar1 = menu.items + menu.icount;
      pnVar1->id = 0;
      pnVar1->role = MI_TEXT;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,pcVar5);
      menu.icount = menu.icount + 1;
    }
    pcVar5 = xprname((obj *)0x0,"Total:",'*','\0',cost_00,0);
    lVar6 = (long)menu.size;
    if (menu.size <= menu.icount) {
      menu.size = menu.size * 2;
      menu.items = (nh_menuitem *)realloc(menu.items,lVar6 * 0x218);
    }
    lVar6 = (long)menu.icount;
    menu.items[lVar6].accel = '\0';
    menu.items[lVar6].group_accel = '\0';
    menu.items[lVar6].selected = '\0';
    menu.items[lVar6].id = 0;
    menu.items[lVar6].role = MI_TEXT;
    menu.items[lVar6].caption[0] = '\0';
    menu.icount = menu.icount + 1;
    lVar6 = (long)menu.size;
    if (menu.size <= menu.icount) {
      menu.size = menu.size * 2;
      menu.items = (nh_menuitem *)realloc(menu.items,lVar6 * 0x218);
    }
    pnVar1 = menu.items + menu.icount;
    pnVar1->id = 0;
    pnVar1->role = MI_TEXT;
    pnVar1->accel = '\0';
    pnVar1->group_accel = '\0';
    pnVar1->selected = '\0';
    strcpy(pnVar1->caption,pcVar5);
    menu.icount = menu.icount + 1;
    display_menu(menu.items,menu.icount,(char *)0x0,0,(int *)0x0);
LAB_0022fc70:
    free(menu.items);
  }
  return 0;
}

Assistant:

int doinvbill(int mode)
{
	struct monst *shkp;
	struct eshk *eshkp;
	struct bill_x *bp, *end_bp;
	struct obj *obj;
	long totused;
	char *buf_p;
	struct menulist menu;

	shkp = shop_keeper(level, *u.ushops);
	if (!shkp || !inhishop(shkp)) {
	    if (mode != 0) warning("doinvbill: no shopkeeper?");
	    return 0;
	}
	eshkp = ESHK(shkp);

	if (mode == 0) {
	    /* count expended items, so that the `I' command can decide
	       whether to include 'x' in its prompt string */
	    int cnt = !eshkp->debit ? 0 : 1;

	    for (bp = eshkp->bill_p, end_bp = &eshkp->bill_p[eshkp->billct];
		    bp < end_bp; bp++)
		if (bp->useup ||
			((obj = bp_to_obj(bp)) != 0 && obj->quan < bp->bquan))
		    cnt++;
	    return cnt;
	}

	init_menulist(&menu);
	add_menutext(&menu, "Unpaid articles already used up:");
	add_menutext(&menu, "");

	totused = 0L;
	for (bp = eshkp->bill_p, end_bp = &eshkp->bill_p[eshkp->billct];
		bp < end_bp; bp++) {
	    obj = bp_to_obj(bp);
	    if (!obj) {
		warning("Bad shopkeeper administration.");
		goto quit;
	    }
	    if (bp->useup || bp->bquan > obj->quan) {
		long oquan, uquan, thisused;
		unsigned save_unpaid;

		save_unpaid = obj->unpaid;
		oquan = obj->quan;
		uquan = (bp->useup ? bp->bquan : bp->bquan - oquan);
		thisused = bp->price * uquan;
		totused += thisused;
		obj->unpaid = 0;		/* ditto */
		/* Why 'x'?  To match `I x', more or less. */
		buf_p = xprname(obj, NULL, 'x', FALSE, thisused, uquan);
		obj->unpaid = save_unpaid;
		add_menutext(&menu, buf_p);
	    }
	}
	if (eshkp->debit) {
	    /* additional shop debt which has no itemization available */
	    if (totused) add_menutext(&menu, "");
	    totused += eshkp->debit;
	    buf_p = xprname(NULL,
			    "usage charges and/or other fees",
			    GOLD_SYM, FALSE, eshkp->debit, 0L);
	    add_menutext(&menu, buf_p);
	}
	buf_p = xprname(NULL, "Total:", '*', FALSE, totused, 0L);
	add_menutext(&menu, "");
	add_menutext(&menu, buf_p);
	
	display_menu(menu.items, menu.icount, NULL, PICK_NONE, NULL);
    quit:
	free(menu.items);
	return 0;
}